

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.cpp
# Opt level: O0

void __thiscall CTestNetParams::CTestNetParams(CTestNetParams *this)

{
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<AssumeutxoData> __l_01;
  initializer_list<std::pair<const_int,_uint256>_> __l_02;
  bool bVar1;
  reference pvVar2;
  uchar *puVar3;
  allocator_type *__a;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_uint256,_unsigned_int>_>,_bool> pVar4;
  CBlock *in_stack_fffffffffffffbe8;
  CBlock *in_stack_fffffffffffffbf0;
  CBlock *in_stack_fffffffffffffbf8;
  allocator_type *in_stack_fffffffffffffc00;
  CBlockHeader *in_stack_fffffffffffffc08;
  vector<AssumeutxoData,_std::allocator<AssumeutxoData>_> *this_00;
  iterator in_stack_fffffffffffffc10;
  uint8_t *puVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffc18;
  uchar *__last;
  allocator_type *__a_00;
  CAmount *in_stack_fffffffffffffc38;
  less<int> *__comp;
  undefined8 in_stack_fffffffffffffc40;
  map<int,_uint256,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_> *this_01;
  CChainParams *in_stack_fffffffffffffc48;
  iterator ppVar6;
  undefined1 *puVar7;
  vector<AssumeutxoData,_std::allocator<AssumeutxoData>_> local_2eb;
  undefined1 local_2ca [32];
  undefined1 local_2aa [32];
  undefined1 local_28a;
  uchar local_289;
  undefined8 local_270;
  undefined4 local_264;
  undefined1 local_260;
  undefined1 local_25f;
  undefined1 local_25e;
  undefined1 local_25d;
  undefined1 local_25c;
  undefined1 local_25b;
  undefined1 local_25a;
  undefined1 local_259;
  _Base_ptr local_258;
  undefined1 local_250;
  undefined1 local_248;
  undefined1 local_247;
  undefined1 local_246;
  undefined1 local_245;
  undefined1 local_244;
  undefined1 local_243;
  undefined1 local_242;
  undefined1 local_241;
  undefined1 local_240;
  undefined1 local_23f;
  undefined1 local_23e;
  undefined1 local_23d;
  undefined1 local_23c;
  undefined1 local_23b;
  undefined1 local_23a;
  undefined1 local_239;
  undefined1 local_238;
  undefined1 local_237;
  undefined1 local_236;
  undefined1 local_235;
  undefined1 local_234;
  undefined1 local_233;
  undefined1 local_232;
  undefined1 local_231;
  undefined1 local_230;
  undefined1 local_22f;
  undefined1 local_22e;
  undefined1 local_22d;
  undefined1 local_22c;
  undefined1 local_22b;
  undefined1 local_22a;
  undefined1 local_229;
  undefined4 local_228;
  undefined8 local_200;
  undefined1 local_1f8;
  undefined1 local_1f7;
  undefined1 local_1f6;
  undefined1 local_1f5;
  undefined1 local_1f4;
  undefined1 local_1f3;
  undefined1 local_1f2;
  undefined1 local_1f1;
  undefined1 local_1f0;
  undefined1 local_1ef;
  undefined1 local_1ee;
  undefined1 local_1ed;
  undefined1 local_1ec;
  undefined1 local_1eb;
  undefined1 local_1ea;
  undefined1 local_1e9;
  undefined1 local_1e8;
  undefined1 local_1e7;
  undefined1 local_1e6;
  undefined1 local_1e5;
  undefined1 local_1e4;
  undefined1 local_1e3;
  undefined1 local_1e2;
  undefined1 local_1e1;
  undefined1 local_1e0;
  undefined1 local_1df;
  undefined1 local_1de;
  undefined1 local_1dd;
  undefined1 local_1dc;
  undefined1 local_1db;
  undefined1 local_1da;
  undefined1 local_1d9;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined4 local_1b8;
  CCheckpointData local_1a8;
  undefined1 local_178;
  undefined1 local_177;
  undefined1 local_176;
  undefined1 local_175;
  undefined1 local_174;
  undefined1 local_173;
  undefined1 local_172;
  undefined1 local_171;
  undefined1 local_170;
  undefined1 local_16f;
  undefined1 local_16e;
  undefined1 local_16d;
  undefined1 local_16c;
  undefined1 local_16b;
  undefined1 local_16a;
  undefined1 local_169;
  undefined1 local_168;
  undefined1 local_167;
  undefined1 local_166;
  undefined1 local_165;
  undefined1 local_164;
  undefined1 local_163;
  undefined1 local_162;
  undefined1 local_161;
  undefined1 local_160;
  undefined1 local_15f;
  undefined1 local_15e;
  undefined1 local_15d;
  undefined1 local_15c;
  undefined1 local_15b;
  undefined1 local_15a;
  undefined1 local_159;
  undefined1 local_158;
  undefined1 local_157;
  undefined1 local_156;
  undefined1 local_155;
  undefined1 local_154;
  undefined1 local_153;
  undefined1 local_152;
  undefined1 local_151;
  undefined1 local_150;
  undefined1 local_14f;
  undefined1 local_14e;
  undefined1 local_14d;
  undefined1 local_14c;
  undefined1 local_14b;
  undefined1 local_14a;
  undefined1 local_149;
  undefined1 local_148;
  undefined1 local_147;
  undefined1 local_146;
  undefined1 local_145;
  undefined1 local_144;
  undefined1 local_143;
  undefined1 local_142;
  undefined1 local_141;
  undefined1 local_140;
  undefined1 local_13f;
  undefined1 local_13e;
  undefined1 local_13d;
  undefined1 local_13c;
  undefined1 local_13b;
  undefined1 local_13a;
  undefined1 local_139;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined1 local_a8;
  undefined1 uStack_a7;
  undefined1 uStack_a6;
  undefined1 uStack_a5;
  undefined1 uStack_a4;
  undefined1 uStack_a3;
  undefined1 uStack_a2;
  undefined1 uStack_a1;
  undefined1 uStack_a0;
  undefined1 uStack_9f;
  undefined1 uStack_9e;
  undefined1 uStack_9d;
  undefined1 uStack_9c;
  undefined1 uStack_9b;
  undefined1 uStack_9a;
  undefined1 uStack_99;
  undefined1 local_98;
  undefined1 uStack_97;
  undefined1 uStack_96;
  undefined1 uStack_95;
  undefined1 uStack_94;
  undefined1 uStack_93;
  undefined1 uStack_92;
  undefined1 uStack_91;
  undefined1 uStack_90;
  undefined1 uStack_8f;
  undefined1 uStack_8e;
  undefined1 uStack_8d;
  undefined1 uStack_8c;
  undefined1 uStack_8b;
  undefined1 uStack_8a;
  undefined1 uStack_89;
  undefined1 local_88;
  undefined1 uStack_87;
  undefined1 uStack_86;
  undefined1 uStack_85;
  undefined1 uStack_84;
  undefined1 uStack_83;
  undefined1 uStack_82;
  undefined1 uStack_81;
  undefined1 uStack_80;
  undefined1 uStack_7f;
  undefined1 uStack_7e;
  undefined1 uStack_7d;
  undefined1 uStack_7c;
  undefined1 uStack_7b;
  undefined1 uStack_7a;
  undefined1 uStack_79;
  undefined1 local_78;
  undefined1 uStack_77;
  undefined1 uStack_76;
  undefined1 uStack_75;
  undefined1 uStack_74;
  undefined1 uStack_73;
  undefined1 uStack_72;
  undefined1 uStack_71;
  undefined1 uStack_70;
  undefined1 uStack_6f;
  undefined1 uStack_6e;
  undefined1 uStack_6d;
  undefined1 uStack_6c;
  undefined1 uStack_6b;
  undefined1 uStack_6a;
  undefined1 uStack_69;
  undefined1 local_68;
  undefined1 uStack_67;
  undefined1 uStack_66;
  undefined1 uStack_65;
  undefined1 uStack_64;
  undefined1 uStack_63;
  undefined1 uStack_62;
  undefined1 uStack_61;
  undefined1 uStack_60;
  undefined1 uStack_5f;
  undefined1 uStack_5e;
  undefined1 uStack_5d;
  undefined1 uStack_5c;
  undefined1 uStack_5b;
  undefined1 uStack_5a;
  undefined1 uStack_59;
  undefined1 local_58;
  undefined1 uStack_57;
  undefined1 uStack_56;
  undefined1 uStack_55;
  undefined1 uStack_54;
  undefined1 uStack_53;
  undefined1 uStack_52;
  undefined1 uStack_51;
  undefined1 uStack_50;
  undefined1 uStack_4f;
  undefined1 uStack_4e;
  undefined1 uStack_4d;
  undefined1 uStack_4c;
  undefined1 uStack_4b;
  undefined1 uStack_4a;
  undefined1 uStack_49;
  undefined1 local_48;
  undefined1 uStack_47;
  undefined1 uStack_46;
  undefined1 uStack_45;
  undefined1 uStack_44;
  undefined1 uStack_43;
  undefined1 uStack_42;
  undefined1 uStack_41;
  undefined1 uStack_40;
  undefined1 uStack_3f;
  undefined1 uStack_3e;
  undefined1 uStack_3d;
  undefined1 uStack_3c;
  undefined1 uStack_3b;
  undefined1 uStack_3a;
  undefined1 uStack_39;
  undefined1 local_38;
  undefined1 uStack_37;
  undefined1 uStack_36;
  undefined1 uStack_35;
  undefined1 uStack_34;
  undefined1 uStack_33;
  undefined1 uStack_32;
  undefined1 uStack_31;
  undefined1 uStack_30;
  undefined1 uStack_2f;
  undefined1 uStack_2e;
  undefined1 uStack_2d;
  undefined1 uStack_2c;
  undefined1 uStack_2b;
  undefined1 uStack_2a;
  undefined1 uStack_29;
  undefined1 local_28;
  undefined1 local_27;
  undefined1 local_26;
  undefined1 local_25;
  undefined1 local_24;
  undefined1 local_23;
  undefined1 local_22;
  undefined1 local_21;
  undefined1 local_20;
  undefined1 local_1f;
  undefined1 local_1e;
  undefined1 local_1d;
  undefined1 local_1c;
  undefined1 local_1b;
  undefined1 local_1a;
  undefined1 local_19;
  undefined1 local_18;
  undefined1 local_17;
  undefined1 local_16;
  undefined1 local_15;
  undefined1 local_14;
  undefined1 local_13;
  undefined1 local_12;
  undefined1 local_11;
  undefined1 local_10;
  undefined1 local_f;
  undefined1 local_e;
  undefined1 local_d;
  undefined1 local_c;
  undefined1 local_b;
  undefined1 local_a;
  undefined1 local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CChainParams::CChainParams(in_stack_fffffffffffffc48);
  *(undefined4 *)(in_RDI + 0x48) = 1;
  *(undefined1 *)(in_RDI + 0x2a) = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbe8);
  *(undefined4 *)(in_RDI + 4) = 210000;
  local_9 = 0;
  local_a = 0;
  local_b = 0;
  local_c = 0;
  local_d = 0xdd;
  local_e = 0x30;
  local_f = 0x45;
  local_10 = 0x7c;
  local_11 = 0;
  local_12 = 0x1f;
  local_13 = 0x40;
  local_14 = 0x95;
  local_15 = 0xd2;
  local_16 = 8;
  local_17 = 0xcc;
  local_18 = 0x12;
  local_19 = 0x96;
  local_1a = 0xb0;
  local_1b = 0xee;
  local_1c = 0xd0;
  local_1d = 2;
  local_1e = 0x42;
  local_1f = 0x7a;
  local_20 = 0xa5;
  local_21 = 0x99;
  local_22 = 0x87;
  local_23 = 0x4a;
  local_24 = 0xf7;
  local_25 = 0xa4;
  local_26 = 0x32;
  local_27 = 0xb1;
  local_28 = 5;
  local_264 = 0;
  pVar4 = std::
          map<uint256,unsigned_int,std::less<uint256>,std::allocator<std::pair<uint256_const,unsigned_int>>>
          ::emplace<uint256,__0>
                    ((map<uint256,_unsigned_int,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_unsigned_int>_>_>
                      *)in_stack_fffffffffffffc08,(uint256 *)in_stack_fffffffffffffc00,
                     (anon_enum_32 *)in_stack_fffffffffffffbf8);
  local_258 = (_Base_ptr)pVar4.first._M_node;
  local_250 = pVar4.second;
  *(undefined4 *)(in_RDI + 0xb) = 0x5277;
  uStack_29 = 0;
  uStack_2a = 0;
  uStack_2b = 0;
  uStack_2c = 0;
  uStack_2d = 0x23;
  uStack_2e = 0xb3;
  uStack_2f = 0xa9;
  uStack_30 = 0x6d;
  uStack_31 = 0x34;
  uStack_32 = 0x84;
  uStack_33 = 0xe5;
  uStack_34 = 0xab;
  uStack_35 = 0xb3;
  uStack_36 = 0x75;
  uStack_37 = 0x5c;
  local_38 = 0x41;
  uStack_39 = 0x3e;
  uStack_3a = 0x7d;
  uStack_3b = 0x41;
  uStack_3c = 0x50;
  uStack_3d = 0xf;
  uStack_3e = 0x8e;
  uStack_3f = 0x2a;
  uStack_40 = 0x5c;
  uStack_41 = 0x3f;
  uStack_42 = 0xd;
  uStack_43 = 0xd0;
  uStack_44 = 0x12;
  uStack_45 = 0x99;
  uStack_46 = 0xcd;
  uStack_47 = 0x8e;
  local_48 = 0xf8;
  *(undefined8 *)((long)in_RDI + 0x6c) = 0x3484e5abb3755c41;
  *(undefined8 *)((long)in_RDI + 0x74) = 0x23b3a96d;
  *(undefined8 *)((long)in_RDI + 0x5c) = 0x3f0dd01299cd8ef8;
  *(undefined8 *)((long)in_RDI + 100) = 0x3e7d41500f8e2a5c;
  *(undefined4 *)((long)in_RDI + 0x7c) = 0x8e0fd;
  *(undefined4 *)(in_RDI + 0x10) = 0x50c18;
  *(undefined4 *)((long)in_RDI + 0x84) = 0xbc040;
  *(undefined4 *)(in_RDI + 0x11) = 0xcbc40;
  *(undefined4 *)((long)in_RDI + 0x8c) = 0xcc420;
  uStack_49 = 0;
  uStack_4a = 0;
  uStack_4b = 0;
  uStack_4c = 0;
  uStack_4d = 0xff;
  uStack_4e = 0xff;
  uStack_4f = 0xff;
  uStack_50 = 0xff;
  uStack_51 = 0xff;
  uStack_52 = 0xff;
  uStack_53 = 0xff;
  uStack_54 = 0xff;
  uStack_55 = 0xff;
  uStack_56 = 0xff;
  uStack_57 = 0xff;
  local_58 = 0xff;
  uStack_59 = 0xff;
  uStack_5a = 0xff;
  uStack_5b = 0xff;
  uStack_5c = 0xff;
  uStack_5d = 0xff;
  uStack_5e = 0xff;
  uStack_5f = 0xff;
  uStack_60 = 0xff;
  uStack_61 = 0xff;
  uStack_62 = 0xff;
  uStack_63 = 0xff;
  uStack_64 = 0xff;
  uStack_65 = 0xff;
  uStack_66 = 0xff;
  uStack_67 = 0xff;
  local_68 = 0xff;
  in_RDI[0x1d] = 0xffffffffffffffff;
  in_RDI[0x1e] = 0xffffffff;
  in_RDI[0x1b] = 0xffffffffffffffff;
  in_RDI[0x1c] = 0xffffffffffffffff;
  in_RDI[0x21] = ::__cxx_global_var_init_8;
  in_RDI[0x20] = 600;
  *(undefined1 *)(in_RDI + 0x1f) = 1;
  *(undefined1 *)((long)in_RDI + 0xf9) = 0;
  *(undefined1 *)((long)in_RDI + 0xfa) = 0;
  *(undefined4 *)(in_RDI + 0x12) = 0x5e8;
  *(undefined4 *)((long)in_RDI + 0x94) = 0x7e0;
  *(undefined4 *)(in_RDI + 0x13) = 0x1c;
  in_RDI[0x14] = 0xfffffffffffffffe;
  in_RDI[0x15] = 0x7fffffffffffffff;
  *(undefined4 *)(in_RDI + 0x16) = 0;
  *(undefined4 *)(in_RDI + 0x17) = 2;
  in_RDI[0x18] = 0x60835f80;
  in_RDI[0x19] = 0x61131300;
  *(undefined4 *)(in_RDI + 0x1a) = 0;
  uStack_69 = 0;
  uStack_6a = 0;
  uStack_6b = 0;
  uStack_6c = 0;
  uStack_6d = 0;
  uStack_6e = 0;
  uStack_6f = 0;
  uStack_70 = 0;
  uStack_71 = 0;
  uStack_72 = 0;
  uStack_73 = 0;
  uStack_74 = 0;
  uStack_75 = 0;
  uStack_76 = 0;
  uStack_77 = 0;
  local_78 = 0;
  uStack_79 = 0;
  uStack_7a = 0;
  uStack_7b = 0;
  uStack_7c = 0;
  uStack_7d = 0;
  uStack_7e = 0;
  uStack_7f = 0xf;
  uStack_80 = 0x20;
  uStack_81 = 0x96;
  uStack_82 = 0x95;
  uStack_83 = 0x16;
  uStack_84 = 0x6b;
  uStack_85 = 0xe8;
  uStack_86 = 0xb6;
  uStack_87 = 0x1f;
  local_88 = 0xa9;
  in_RDI[0x24] = 0;
  in_RDI[0x25] = 0;
  in_RDI[0x22] = 0x9695166be8b61fa9;
  in_RDI[0x23] = 0xf20;
  uStack_89 = 0;
  uStack_8a = 0;
  uStack_8b = 0;
  uStack_8c = 0;
  uStack_8d = 0;
  uStack_8e = 0;
  uStack_8f = 0;
  uStack_90 = 4;
  uStack_91 = 0x65;
  uStack_92 = 0xb1;
  uStack_93 = 0xa6;
  uStack_94 = 0x6c;
  uStack_95 = 0x9f;
  uStack_96 = 0x38;
  uStack_97 = 99;
  local_98 = 8;
  uStack_99 = 0xe8;
  uStack_9a = 199;
  uStack_9b = 0x5a;
  uStack_9c = 0xce;
  uStack_9d = 0xf9;
  uStack_9e = 0x20;
  uStack_9f = 0x1f;
  uStack_a0 = 0x3f;
  uStack_a1 = 0x57;
  uStack_a2 = 0x78;
  uStack_a3 = 0x11;
  uStack_a4 = 0xda;
  uStack_a5 = 9;
  uStack_a6 = 0xfc;
  uStack_a7 = 0x90;
  local_a8 = 0xad;
  in_RDI[0x28] = 0x65b1a66c9f386308;
  in_RDI[0x29] = 4;
  in_RDI[0x26] = 0x577811da09fc90ad;
  in_RDI[0x27] = 0xe8c75acef9201f3f;
  pvVar2 = std::array<unsigned_char,_4UL>::operator[]
                     ((array<unsigned_char,_4UL> *)in_stack_fffffffffffffbf8,
                      (size_type)in_stack_fffffffffffffbf0);
  *pvVar2 = '\v';
  pvVar2 = std::array<unsigned_char,_4UL>::operator[]
                     ((array<unsigned_char,_4UL> *)in_stack_fffffffffffffbf8,
                      (size_type)in_stack_fffffffffffffbf0);
  *pvVar2 = '\x11';
  pvVar2 = std::array<unsigned_char,_4UL>::operator[]
                     ((array<unsigned_char,_4UL> *)in_stack_fffffffffffffbf8,
                      (size_type)in_stack_fffffffffffffbf0);
  *pvVar2 = '\t';
  pvVar2 = std::array<unsigned_char,_4UL>::operator[]
                     ((array<unsigned_char,_4UL> *)in_stack_fffffffffffffbf8,
                      (size_type)in_stack_fffffffffffffbf0);
  *pvVar2 = '\a';
  *(undefined2 *)((long)in_RDI + 0x174) = 0x479d;
  in_RDI[0x2f] = 1000;
  in_RDI[0x30] = 0x5d;
  in_RDI[0x31] = 0x13;
  local_270 = 5000000000;
  CreateGenesisBlock((uint32_t)((ulong)in_stack_fffffffffffffc48 >> 0x20),
                     (uint32_t)in_stack_fffffffffffffc48,
                     (uint32_t)((ulong)in_stack_fffffffffffffc40 >> 0x20),
                     (int32_t)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  CBlock::operator=(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  CBlock::~CBlock(in_stack_fffffffffffffbe8);
  CBlockHeader::GetHash(in_stack_fffffffffffffc08);
  in_RDI[2] = local_128;
  in_RDI[3] = uStack_120;
  *in_RDI = local_138;
  in_RDI[1] = uStack_130;
  local_139 = 0;
  local_13a = 0;
  local_13b = 0;
  local_13c = 0;
  local_13d = 9;
  local_13e = 0x33;
  local_13f = 0xea;
  local_140 = 1;
  local_141 = 0xad;
  local_142 = 0xe;
  local_143 = 0xe9;
  local_144 = 0x84;
  local_145 = 0x20;
  local_146 = 0x97;
  local_147 = 0x79;
  local_148 = 0xba;
  local_149 = 0xae;
  local_14a = 0xc3;
  local_14b = 0xce;
  local_14c = 0xd9;
  local_14d = 0xf;
  local_14e = 0xa3;
  local_14f = 0xf4;
  local_150 = 8;
  local_151 = 0x71;
  local_152 = 0x95;
  local_153 = 0x26;
  local_154 = 0xf8;
  local_155 = 0xd7;
  local_156 = 0x7f;
  local_157 = 0x49;
  local_158 = 0x43;
  bVar1 = ::operator==((base_blob<256U> *)in_stack_fffffffffffffbf8,
                       (base_blob<256U> *)in_stack_fffffffffffffbf0);
  if (!bVar1) {
    __assert_fail("consensus.hashGenesisBlock == uint256{\"000000000933ea01ad0ee984209779baaec3ced90fa3f408719526f8d77f4943\"}"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/kernel/chainparams.cpp"
                  ,0x102,"CTestNetParams::CTestNetParams()");
  }
  local_159 = 0x4a;
  local_15a = 0x5e;
  local_15b = 0x1e;
  local_15c = 0x4b;
  local_15d = 0xaa;
  local_15e = 0xb8;
  local_15f = 0x9f;
  local_160 = 0x3a;
  local_161 = 0x32;
  local_162 = 0x51;
  local_163 = 0x8a;
  local_164 = 0x88;
  local_165 = 0xc3;
  local_166 = 0x1b;
  local_167 = 200;
  local_168 = 0x7f;
  local_169 = 0x61;
  local_16a = 0x8f;
  local_16b = 0x76;
  local_16c = 0x67;
  local_16d = 0x3e;
  local_16e = 0x2c;
  local_16f = 199;
  local_170 = 0x7a;
  local_171 = 0xb2;
  local_172 = 0x12;
  local_173 = 0x7b;
  local_174 = 0x7a;
  local_175 = 0xfd;
  local_176 = 0xed;
  local_177 = 0xa3;
  local_178 = 0x3b;
  bVar1 = ::operator==((base_blob<256U> *)in_stack_fffffffffffffbf8,
                       (base_blob<256U> *)in_stack_fffffffffffffbf0);
  if (!bVar1) {
    __assert_fail("genesis.hashMerkleRoot == uint256{\"4a5e1e4baab89f3a32518a88c31bc87f618f76673e2cc77ab2127b7afdeda33b\"}"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/kernel/chainparams.cpp"
                  ,0x103,"CTestNetParams::CTestNetParams()");
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbe8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_fffffffffffffbe8);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[39]>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffc08,(char (*) [39])in_stack_fffffffffffffc00);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[25]>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffc08,(char (*) [25])in_stack_fffffffffffffc00);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[35]>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffc08,(char (*) [35])in_stack_fffffffffffffc00);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[26]>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffc08,(char (*) [26])in_stack_fffffffffffffc00);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[29]>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffc08,(char (*) [29])in_stack_fffffffffffffc00);
  local_289 = 'o';
  puVar7 = &local_28a;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffffbe8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_fffffffffffffc18,(size_type)in_stack_fffffffffffffc10,
             (value_type_conflict *)in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbf8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbf0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbf8);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffffbe8);
  local_2aa[1] = 0xc4;
  ppVar6 = (iterator)local_2aa;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffffbe8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_fffffffffffffc18,(size_type)in_stack_fffffffffffffc10,
             (value_type_conflict *)in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
  __comp = (less<int> *)(local_2aa + 2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbf8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbf0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbf8);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffffbe8);
  local_2ca[1] = 0xef;
  this_01 = (map<int,_uint256,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_> *)
            local_2ca;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffffbe8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_fffffffffffffc18,(size_type)in_stack_fffffffffffffc10,
             (value_type_conflict *)in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
  __a_00 = (allocator_type *)(local_2ca + 2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbf8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbf0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbf8);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffffbe8);
  local_25c = 4;
  local_25b = 0x35;
  local_25a = 0x87;
  local_259 = 0xcf;
  __l._M_len = (size_type)in_stack_fffffffffffffc18;
  __l._M_array = in_stack_fffffffffffffc10;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc08,__l)
  ;
  local_260 = 4;
  local_25f = 0x35;
  local_25e = 0x83;
  local_25d = 0x94;
  __l_00._M_len = (size_type)in_stack_fffffffffffffc18;
  __l_00._M_array = in_stack_fffffffffffffc10;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc08,
             __l_00);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbf8,(char *)in_stack_fffffffffffffbf0);
  puVar5 = chainparams_seed_test;
  puVar3 = std::begin<unsigned_char_const,6876ul>((uchar (*) [6876])in_stack_fffffffffffffbe8);
  __a = (allocator_type *)
        std::end<unsigned_char_const,6876ul>((uchar (*) [6876])in_stack_fffffffffffffbe8);
  __last = (uchar *)((long)&local_2eb.
                            super__Vector_base<AssumeutxoData,_std::allocator<AssumeutxoData>_>.
                            _M_impl.super__Vector_impl_data._M_start + 2);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffffbe8);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__a_00,(uchar *)__comp,__last,
             __a);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbf8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbf0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbf8);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffffbe8);
  *(undefined1 *)(in_RDI + 0x5a) = 0;
  *(undefined1 *)((long)in_RDI + 0x2d1) = 0;
  local_1c8 = 0x35fce2f3556c559c;
  uStack_1c0 = 0x2a936ca763904c3c;
  local_1d8 = 0xf76acb7000000222;
  uStack_1d0 = 0x214345d31b1bceb;
  local_1b8 = 0;
  this_00 = &local_2eb;
  std::allocator<std::pair<const_int,_uint256>_>::allocator
            ((allocator<std::pair<const_int,_uint256>_> *)in_stack_fffffffffffffbe8);
  __l_02._M_len = (size_type)puVar7;
  __l_02._M_array = ppVar6;
  std::map<int,_uint256,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>::map
            (this_01,__l_02,__comp,__a_00);
  CCheckpointData::operator=(&local_1a8,(CCheckpointData *)in_stack_fffffffffffffbf0);
  CCheckpointData::~CCheckpointData((CCheckpointData *)in_stack_fffffffffffffbe8);
  std::allocator<std::pair<const_int,_uint256>_>::~allocator
            ((allocator<std::pair<const_int,_uint256>_> *)in_stack_fffffffffffffbe8);
  local_228 = 2500000;
  local_229 = 0xf8;
  local_22a = 0x41;
  local_22b = 0x58;
  local_22c = 0x49;
  local_22d = 9;
  local_22e = 0xf6;
  local_22f = 0x8e;
  local_230 = 0x47;
  local_231 = 0x89;
  local_232 = 0x79;
  local_233 = 0x52;
  local_234 = 0x34;
  local_235 = 0x52;
  local_236 = 0x34;
  local_237 = 0xe3;
  local_238 = 0x7f;
  local_239 = 0xcd;
  local_23a = 0x91;
  local_23b = 0x28;
  local_23c = 0xcd;
  local_23d = 0x81;
  local_23e = 0x8f;
  local_23f = 0x41;
  local_240 = 0xee;
  local_241 = 0x6c;
  local_242 = 0x3c;
  local_243 = 0xa6;
  local_244 = 0x8d;
  local_245 = 0xb8;
  local_246 = 7;
  local_247 = 0x1b;
  local_248 = 0xe7;
  AssumeutxoHash::AssumeutxoHash((AssumeutxoHash *)in_stack_fffffffffffffbe8,(uint256 *)0x671415);
  local_200 = 0x3f67948;
  local_1d9 = 0;
  local_1da = 0;
  local_1db = 0;
  local_1dc = 0;
  local_1dd = 0;
  local_1de = 0;
  local_1df = 0;
  local_1e0 = 0x93;
  local_1e1 = 0xbc;
  local_1e2 = 0xb6;
  local_1e3 = 0x8c;
  local_1e4 = 3;
  local_1e5 = 0xa9;
  local_1e6 = 0xa1;
  local_1e7 = 0x68;
  local_1e8 = 0xae;
  local_1e9 = 0x25;
  local_1ea = 0x25;
  local_1eb = 0x72;
  local_1ec = 0xd3;
  local_1ed = 0x48;
  local_1ee = 0xa2;
  local_1ef = 0xea;
  local_1f0 = 0xeb;
  local_1f1 = 0xa2;
  local_1f2 = 0xcd;
  local_1f3 = 0xf9;
  local_1f4 = 0x23;
  local_1f5 = 0x1d;
  local_1f6 = 0x73;
  local_1f7 = 0x20;
  local_1f8 = 0x6f;
  __l_01._M_len = (size_type)puVar3;
  __l_01._M_array = (iterator)puVar5;
  std::vector<AssumeutxoData,_std::allocator<AssumeutxoData>_>::operator=(this_00,__l_01);
  in_RDI[0x66] = 0x400a1ed34f23c54d;
  *(undefined4 *)(in_RDI + 100) = 0x66bc409d;
  *(undefined4 *)((long)in_RDI + 0x324) = 0;
  *(undefined4 *)(in_RDI + 0x65) = 0xb33631a;
  *(undefined4 *)((long)in_RDI + 0x32c) = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CTestNetParams() {
        m_chain_type = ChainType::TESTNET;
        consensus.signet_blocks = false;
        consensus.signet_challenge.clear();
        consensus.nSubsidyHalvingInterval = 210000;
        consensus.script_flag_exceptions.emplace( // BIP16 exception
            uint256{"00000000dd30457c001f4095d208cc1296b0eed002427aa599874af7a432b105"}, SCRIPT_VERIFY_NONE);
        consensus.BIP34Height = 21111;
        consensus.BIP34Hash = uint256{"0000000023b3a96d3484e5abb3755c413e7d41500f8e2a5c3f0dd01299cd8ef8"};
        consensus.BIP65Height = 581885; // 00000000007f6655f22f98e72ed80d8b06dc761d5da09df0fa1dc4be4f861eb6
        consensus.BIP66Height = 330776; // 000000002104c8c45e99a8853285a3b592602a3ccde2b832481da85e9e4ba182
        consensus.CSVHeight = 770112; // 00000000025e930139bac5c6c31a403776da130831ab85be56578f3fa75369bb
        consensus.SegwitHeight = 834624; // 00000000002b980fcd729daaa248fd9316a5200e9b367f4ff2c42453e84201ca
        consensus.MinBIP9WarningHeight = 836640; // segwit activation height + miner confirmation window
        consensus.powLimit = uint256{"00000000ffffffffffffffffffffffffffffffffffffffffffffffffffffffff"};
        consensus.nPowTargetTimespan = 14 * 24 * 60 * 60; // two weeks
        consensus.nPowTargetSpacing = 10 * 60;
        consensus.fPowAllowMinDifficultyBlocks = true;
        consensus.enforce_BIP94 = false;
        consensus.fPowNoRetargeting = false;
        consensus.nRuleChangeActivationThreshold = 1512; // 75% for testchains
        consensus.nMinerConfirmationWindow = 2016; // nPowTargetTimespan / nPowTargetSpacing
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].bit = 28;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].nStartTime = Consensus::BIP9Deployment::NEVER_ACTIVE;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].nTimeout = Consensus::BIP9Deployment::NO_TIMEOUT;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].min_activation_height = 0; // No activation delay

        // Deployment of Taproot (BIPs 340-342)
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].bit = 2;
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].nStartTime = 1619222400; // April 24th, 2021
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].nTimeout = 1628640000; // August 11th, 2021
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].min_activation_height = 0; // No activation delay

        consensus.nMinimumChainWork = uint256{"000000000000000000000000000000000000000000000f209695166be8b61fa9"};
        consensus.defaultAssumeValid = uint256{"000000000000000465b1a66c9f386308e8c75acef9201f3f577811da09fc90ad"}; // 2873500

        pchMessageStart[0] = 0x0b;
        pchMessageStart[1] = 0x11;
        pchMessageStart[2] = 0x09;
        pchMessageStart[3] = 0x07;
        nDefaultPort = 18333;
        nPruneAfterHeight = 1000;
        m_assumed_blockchain_size = 93;
        m_assumed_chain_state_size = 19;

        genesis = CreateGenesisBlock(1296688602, 414098458, 0x1d00ffff, 1, 50 * COIN);
        consensus.hashGenesisBlock = genesis.GetHash();
        assert(consensus.hashGenesisBlock == uint256{"000000000933ea01ad0ee984209779baaec3ced90fa3f408719526f8d77f4943"});
        assert(genesis.hashMerkleRoot == uint256{"4a5e1e4baab89f3a32518a88c31bc87f618f76673e2cc77ab2127b7afdeda33b"});

        vFixedSeeds.clear();
        vSeeds.clear();
        // nodes with support for servicebits filtering should be at the top
        vSeeds.emplace_back("testnet-seed.bitcoin.jonasschnelli.ch.");
        vSeeds.emplace_back("seed.tbtc.petertodd.net.");
        vSeeds.emplace_back("seed.testnet.bitcoin.sprovoost.nl.");
        vSeeds.emplace_back("testnet-seed.bluematt.me."); // Just a static list of stable node(s), only supports x9
        vSeeds.emplace_back("seed.testnet.achownodes.xyz."); // Ava Chow, only supports x1, x5, x9, x49, x809, x849, xd, x400, x404, x408, x448, xc08, xc48, x40c

        base58Prefixes[PUBKEY_ADDRESS] = std::vector<unsigned char>(1,111);
        base58Prefixes[SCRIPT_ADDRESS] = std::vector<unsigned char>(1,196);
        base58Prefixes[SECRET_KEY] =     std::vector<unsigned char>(1,239);
        base58Prefixes[EXT_PUBLIC_KEY] = {0x04, 0x35, 0x87, 0xCF};
        base58Prefixes[EXT_SECRET_KEY] = {0x04, 0x35, 0x83, 0x94};

        bech32_hrp = "tb";

        vFixedSeeds = std::vector<uint8_t>(std::begin(chainparams_seed_test), std::end(chainparams_seed_test));

        fDefaultConsistencyChecks = false;
        m_is_mockable_chain = false;

        checkpointData = {
            {
                {546, uint256{"000000002a936ca763904c3c35fce2f3556c559c0214345d31b1bcebf76acb70"}},
            }
        };

        m_assumeutxo_data = {
            {
                .height = 2'500'000,
                .hash_serialized = AssumeutxoHash{uint256{"f841584909f68e47897952345234e37fcd9128cd818f41ee6c3ca68db8071be7"}},
                .m_chain_tx_count = 66484552,
                .blockhash = consteval_ctor(uint256{"0000000000000093bcb68c03a9a168ae252572d348a2eaeba2cdf9231d73206f"}),
            }
        };

        chainTxData = ChainTxData{
            // Data from RPC: getchaintxstats 4096 000000000000000465b1a66c9f386308e8c75acef9201f3f577811da09fc90ad
            .nTime    = 1723613341,
            .tx_count = 187917082,
            .dTxRate  = 3.265051477698455,
        };
    }